

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

bool __thiscall pstore::storage::request_spans_regions(storage *this,address *addr,size_t size)

{
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Var1;
  ulong uVar2;
  address aVar3;
  
  if (size != 0) {
    _Var1._M_head_impl =
         (this->sat_)._M_t.
         super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
    uVar2 = addr->a_;
    aVar3 = operator-((address)(size + uVar2),1);
    return *(long *)((long)(_Var1._M_head_impl)->_M_elems +
                    (ulong)(((uint)(uVar2 >> 0x16) & 0xffff) << 5) + 0x10) !=
           *(long *)((long)(_Var1._M_head_impl)->_M_elems +
                    (ulong)(((uint)(aVar3.a_ >> 0x16) & 0xffff) << 5) + 0x10);
  }
  return false;
}

Assistant:

inline bool storage::request_spans_regions (address const & addr, std::size_t const size) const
        noexcept {
        (void) addr;
        if (size == 0) {
            return false;
        }
#ifdef PSTORE_ALWAYS_SPANNING
        return true;
#else
        return (*sat_)[addr.segment ()].region != (*sat_)[(addr + size - 1U).segment ()].region;
#endif // PSTORE_ALWAYS_SPANNING
    }